

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_6aa98::DepsLogTestWriteRead::Run(DepsLogTestWriteRead *this)

{
  Node *pNVar1;
  Test *pTVar2;
  bool bVar3;
  LoadStatus LVar4;
  Node *pNVar5;
  Deps *pDVar6;
  int i;
  ulong uVar7;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  StringPiece path_03;
  StringPiece path_04;
  StringPiece path_05;
  StringPiece path_06;
  allocator<char> local_349;
  string err;
  DepsLog log2;
  string local_2c8;
  DepsLog log1;
  State state2;
  State state1;
  
  State::State(&state1);
  pTVar2 = g_current_test;
  log1.file_path_._M_dataplus._M_p = (pointer)&log1.file_path_.field_2;
  log1.needs_recompaction_ = false;
  log1.file_ = (FILE *)0x0;
  log1.file_path_._M_string_length = 0;
  log1.file_path_.field_2._M_local_buf[0] = '\0';
  log1.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  log1.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  log1.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  log1.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  log1.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  log1.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&state2,"DepsLogTest-tempfile",(allocator<char> *)&log2);
  bVar3 = DepsLog::OpenForWrite(&log1,(string *)&state2,&err);
  testing::Test::Check
            (pTVar2,bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
             ,0x2e,"log1.OpenForWrite(kTestFilename, &err)");
  std::__cxx11::string::~string((string *)&state2);
  pTVar2 = g_current_test;
  bVar3 = std::operator==("",&err);
  bVar3 = testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x2f,"\"\" == err");
  if (bVar3) {
    state2.paths_._M_h._M_buckets = (__buckets_ptr)0x0;
    state2.paths_._M_h._M_bucket_count = 0;
    state2.paths_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    path.len_ = 5;
    path.str_ = "foo.h";
    log2._0_8_ = State::GetNode(&state1,path,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&state2,(Node **)&log2);
    path_00.len_ = 5;
    path_00.str_ = "bar.h";
    log2._0_8_ = State::GetNode(&state1,path_00,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&state2,(Node **)&log2);
    path_01.len_ = 5;
    path_01.str_ = "out.o";
    pNVar5 = State::GetNode(&state1,path_01,0);
    DepsLog::RecordDeps(&log1,pNVar5,1,(vector<Node_*,_std::allocator<Node_*>_> *)&state2);
    if ((__buckets_ptr)state2.paths_._M_h._M_bucket_count != state2.paths_._M_h._M_buckets) {
      state2.paths_._M_h._M_bucket_count = (size_type)state2.paths_._M_h._M_buckets;
    }
    path_02.len_ = 5;
    path_02.str_ = "foo.h";
    log2._0_8_ = State::GetNode(&state1,path_02,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&state2,(Node **)&log2);
    path_03.len_ = 6;
    path_03.str_ = "bar2.h";
    log2._0_8_ = State::GetNode(&state1,path_03,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&state2,(Node **)&log2);
    path_04.len_ = 6;
    path_04.str_ = "out2.o";
    pNVar5 = State::GetNode(&state1,path_04,0);
    DepsLog::RecordDeps(&log1,pNVar5,2,(vector<Node_*,_std::allocator<Node_*>_> *)&state2);
    path_05.len_ = 5;
    path_05.str_ = "out.o";
    pNVar5 = State::GetNode(&state1,path_05,0);
    pDVar6 = DepsLog::GetDeps(&log1,pNVar5);
    bVar3 = testing::Test::Check
                      (g_current_test,pDVar6 != (Deps *)0x0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                       ,0x3d,"log_deps");
    if (((bVar3) &&
        (bVar3 = testing::Test::Check
                           (g_current_test,pDVar6->mtime == 1,
                            "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                            ,0x3e,"1 == log_deps->mtime"), bVar3)) &&
       (bVar3 = testing::Test::Check
                          (g_current_test,pDVar6->node_count == 2,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                           ,0x3f,"2 == log_deps->node_count"), pTVar2 = g_current_test, bVar3)) {
      bVar3 = std::operator==("foo.h",&(*pDVar6->nodes)->path_);
      bVar3 = testing::Test::Check
                        (pTVar2,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x40,"\"foo.h\" == log_deps->nodes[0]->path()");
      pTVar2 = g_current_test;
      if (bVar3) {
        bVar3 = std::operator==("bar.h",&pDVar6->nodes[1]->path_);
        bVar3 = testing::Test::Check
                          (pTVar2,bVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                           ,0x41,"\"bar.h\" == log_deps->nodes[1]->path()");
        if (bVar3) {
          std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
                    ((_Vector_base<Node_*,_std::allocator<Node_*>_> *)&state2);
          DepsLog::Close(&log1);
          State::State(&state2);
          pTVar2 = g_current_test;
          log2.file_path_._M_dataplus._M_p = (pointer)&log2.file_path_.field_2;
          log2._0_8_ = log2._0_8_ & 0xffffffffffffff00;
          log2.file_ = (FILE *)0x0;
          log2.file_path_._M_string_length = 0;
          log2.file_path_.field_2._M_local_buf[0] = '\0';
          log2.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          log2.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          log2.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          log2.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          log2.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          log2.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c8,"DepsLogTest-tempfile",&local_349);
          LVar4 = DepsLog::Load(&log2,&local_2c8,&state2,&err);
          testing::Test::Check
                    (pTVar2,LVar4 != LOAD_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x48,"log2.Load(kTestFilename, &state2, &err)");
          std::__cxx11::string::~string((string *)&local_2c8);
          pTVar2 = g_current_test;
          bVar3 = std::operator==("",&err);
          bVar3 = testing::Test::Check
                            (pTVar2,bVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                             ,0x49,"\"\" == err");
          if ((bVar3) &&
             (bVar3 = testing::Test::Check
                                (g_current_test,
                                 (long)log1.nodes_.
                                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)log1.nodes_.
                                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                       super__Vector_impl_data._M_start ==
                                 (long)log2.nodes_.
                                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)log2.nodes_.
                                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                       super__Vector_impl_data._M_start,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                 ,0x4b,"log1.nodes().size() == log2.nodes().size()"), bVar3)) {
            uVar7 = 0;
            do {
              if ((long)(int)((ulong)((long)log1.nodes_.
                                            super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)log1.nodes_.
                                           super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 3) <=
                  (long)uVar7) {
                path_06.len_ = 6;
                path_06.str_ = "out2.o";
                pNVar5 = State::GetNode(&state2,path_06,0);
                pDVar6 = DepsLog::GetDeps(&log2,pNVar5);
                bVar3 = testing::Test::Check
                                  (g_current_test,pDVar6 != (Deps *)0x0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                   ,0x55,"log_deps");
                if (((bVar3) &&
                    (bVar3 = testing::Test::Check
                                       (g_current_test,pDVar6->mtime == 2,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                        ,0x56,"2 == log_deps->mtime"), bVar3)) &&
                   (bVar3 = testing::Test::Check
                                      (g_current_test,pDVar6->node_count == 2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                       ,0x57,"2 == log_deps->node_count"), pTVar2 = g_current_test,
                   bVar3)) {
                  bVar3 = std::operator==("foo.h",&(*pDVar6->nodes)->path_);
                  bVar3 = testing::Test::Check
                                    (pTVar2,bVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                     ,0x58,"\"foo.h\" == log_deps->nodes[0]->path()");
                  pTVar2 = g_current_test;
                  if (bVar3) {
                    bVar3 = std::operator==("bar2.h",&pDVar6->nodes[1]->path_);
                    bVar3 = testing::Test::Check
                                      (pTVar2,bVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                       ,0x59,"\"bar2.h\" == log_deps->nodes[1]->path()");
                    if (bVar3) goto LAB_00152810;
                  }
                }
                break;
              }
              pNVar5 = log1.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7];
              pNVar1 = log2.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7];
              bVar3 = testing::Test::Check
                                (g_current_test,uVar7 == (uint)pNVar5->id_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                 ,0x4f,"i == node1->id()");
              if (!bVar3) break;
              bVar3 = testing::Test::Check
                                (g_current_test,pNVar5->id_ == pNVar1->id_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                 ,0x50,"node1->id() == node2->id()");
              uVar7 = uVar7 + 1;
            } while (bVar3);
          }
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00152810:
          DepsLog::~DepsLog(&log2);
          State::~State(&state2);
          goto LAB_00152847;
        }
      }
    }
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
              ((_Vector_base<Node_*,_std::allocator<Node_*>_> *)&state2);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
LAB_00152847:
  std::__cxx11::string::~string((string *)&err);
  DepsLog::~DepsLog(&log1);
  State::~State(&state1);
  return;
}

Assistant:

TEST_F(DepsLogTest, WriteRead) {
  State state1;
  DepsLog log1;
  string err;
  EXPECT_TRUE(log1.OpenForWrite(kTestFilename, &err));
  ASSERT_EQ("", err);

  {
    vector<Node*> deps;
    deps.push_back(state1.GetNode("foo.h", 0));
    deps.push_back(state1.GetNode("bar.h", 0));
    log1.RecordDeps(state1.GetNode("out.o", 0), 1, deps);

    deps.clear();
    deps.push_back(state1.GetNode("foo.h", 0));
    deps.push_back(state1.GetNode("bar2.h", 0));
    log1.RecordDeps(state1.GetNode("out2.o", 0), 2, deps);

    DepsLog::Deps* log_deps = log1.GetDeps(state1.GetNode("out.o", 0));
    ASSERT_TRUE(log_deps);
    ASSERT_EQ(1, log_deps->mtime);
    ASSERT_EQ(2, log_deps->node_count);
    ASSERT_EQ("foo.h", log_deps->nodes[0]->path());
    ASSERT_EQ("bar.h", log_deps->nodes[1]->path());
  }

  log1.Close();

  State state2;
  DepsLog log2;
  EXPECT_TRUE(log2.Load(kTestFilename, &state2, &err));
  ASSERT_EQ("", err);

  ASSERT_EQ(log1.nodes().size(), log2.nodes().size());
  for (int i = 0; i < (int)log1.nodes().size(); ++i) {
    Node* node1 = log1.nodes()[i];
    Node* node2 = log2.nodes()[i];
    ASSERT_EQ(i, node1->id());
    ASSERT_EQ(node1->id(), node2->id());
  }

  // Spot-check the entries in log2.
  DepsLog::Deps* log_deps = log2.GetDeps(state2.GetNode("out2.o", 0));
  ASSERT_TRUE(log_deps);
  ASSERT_EQ(2, log_deps->mtime);
  ASSERT_EQ(2, log_deps->node_count);
  ASSERT_EQ("foo.h", log_deps->nodes[0]->path());
  ASSERT_EQ("bar2.h", log_deps->nodes[1]->path());
}